

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

Quat * __thiscall rw::Quat::rotate(Quat *this,V3d *axis,float32 angle,CombineOp op)

{
  Quat *p;
  Quat *q;
  Quat QVar1;
  Quat rot;
  Quat local_20;
  
  local_20 = rotation(angle,axis);
  if (op == COMBINEPOSTCONCAT) {
    q = &local_20;
    p = this;
  }
  else {
    if (op != COMBINEPRECONCAT) {
      if (op != COMBINEREPLACE) {
        return this;
      }
      this->x = local_20.x;
      this->y = local_20.y;
      this->z = local_20.z;
      this->w = local_20.w;
      return this;
    }
    p = &local_20;
    q = this;
  }
  QVar1 = mult(q,p);
  *this = QVar1;
  return this;
}

Assistant:

Quat*
Quat::rotate(const V3d *axis, float32 angle, CombineOp op)
{
	Quat rot = rotation(angle, *axis);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		*this = mult(*this, rot);
		break;
	case COMBINEPOSTCONCAT:
		*this = mult(rot, *this);
		break;
	}
	return this;
}